

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map.h
# Opt level: O0

const_iterator __thiscall
frozen::
unordered_map<frozen::basic_string<char>,int,128ul,frozen::elsa<frozen::basic_string<char>>,std::equal_to<frozen::basic_string<char>>>
::find<frozen::basic_string<char>>
          (unordered_map<frozen::basic_string<char>,int,128ul,frozen::elsa<frozen::basic_string<char>>,std::equal_to<frozen::basic_string<char>>>
           *this,basic_string<char> *key)

{
  hasher *hash;
  key_equal *equal;
  const_iterator pvVar1;
  basic_string<char> *key_local;
  unordered_map<frozen::basic_string<char>,_int,_128UL,_frozen::elsa<frozen::basic_string<char>_>,_std::equal_to<frozen::basic_string<char>_>_>
  *this_local;
  
  hash = unordered_map<frozen::basic_string<char>,_int,_128UL,_frozen::elsa<frozen::basic_string<char>_>,_std::equal_to<frozen::basic_string<char>_>_>
         ::hash_function((unordered_map<frozen::basic_string<char>,_int,_128UL,_frozen::elsa<frozen::basic_string<char>_>,_std::equal_to<frozen::basic_string<char>_>_>
                          *)this);
  equal = unordered_map<frozen::basic_string<char>,_int,_128UL,_frozen::elsa<frozen::basic_string<char>_>,_std::equal_to<frozen::basic_string<char>_>_>
          ::key_eq((unordered_map<frozen::basic_string<char>,_int,_128UL,_frozen::elsa<frozen::basic_string<char>_>,_std::equal_to<frozen::basic_string<char>_>_>
                    *)this);
  pvVar1 = find_impl<frozen::unordered_map<frozen::basic_string<char>,int,128ul,frozen::elsa<frozen::basic_string<char>>,std::equal_to<frozen::basic_string<char>>>const&,frozen::basic_string<char>,frozen::elsa<frozen::basic_string<char>>,std::equal_to<frozen::basic_string<char>>>
                     ((unordered_map<frozen::basic_string<char>,_int,_128UL,_frozen::elsa<frozen::basic_string<char>_>,_std::equal_to<frozen::basic_string<char>_>_>
                       *)this,key,hash,equal);
  return pvVar1;
}

Assistant:

constexpr const_iterator find(KeyType const &key) const {
    return find_impl(*this, key, hash_function(), key_eq());
  }